

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

Var BailOutRecord::BailOutCommonNoCodeGen
              (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,uint32 bailOutOffset,
              void *returnAddress,BailOutKind bailOutKind,Var branchValue,Var *registerSaves,
              BailOutReturnValue *bailOutReturnValue,void *argoutRestoreAddress)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var *pArgumentsObject;
  Var pvVar4;
  void *in_stack_ffffffffffffff98;
  undefined1 local_50 [8];
  ArgumentReader args;
  
  args.super_Arguments.Values = (Type)branchValue;
  if (bailOutRecord->parent != (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x47d,"(bailOutRecord->parent == nullptr)",
                       "bailOutRecord->parent == nullptr");
    if (!bVar2) goto LAB_003fa8c2;
    *puVar3 = 0;
  }
  bVar2 = Js::VarIs<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x47e,"(Js::VarIs<Js::ScriptFunction>(layout->functionObject))",
                       "Js::VarIs<Js::ScriptFunction>(layout->functionObject)");
    if (!bVar2) {
LAB_003fa8c2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  args.super_Arguments.Info = (Type)((long)layout + 0x10);
  local_50 = *(undefined1 (*) [8])(layout + 8);
  Js::ArgumentReader::AdjustArguments((ArgumentReader *)local_50,(CallInfo *)(layout + 8));
  pArgumentsObject = Js::JavascriptCallStackLayout::GetArgumentsObjectLocation(layout);
  pvVar4 = BailOutHelper(layout,(ScriptFunction **)layout,(Arguments *)local_50,false,bailOutRecord,
                         bailOutOffset,returnAddress,bailOutKind,registerSaves,bailOutReturnValue,
                         pArgumentsObject,args.super_Arguments.Values,in_stack_ffffffffffffff98);
  return pvVar4;
}

Assistant:

Js::Var
BailOutRecord::BailOutCommonNoCodeGen(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord,
    uint32 bailOutOffset, void * returnAddress, IR::BailOutKind bailOutKind, Js::Var branchValue, Js::Var * registerSaves,
    BailOutReturnValue * bailOutReturnValue, void * argoutRestoreAddress)
{
    Assert(bailOutRecord->parent == nullptr);
    Assert(Js::VarIs<Js::ScriptFunction>(layout->functionObject));
    Js::ScriptFunction ** functionRef = (Js::ScriptFunction **)&layout->functionObject;
    Js::ArgumentReader args(&layout->callInfo, layout->args);
    Js::Var result = BailOutHelper(layout, functionRef, args, false, bailOutRecord, bailOutOffset, returnAddress, bailOutKind, registerSaves, bailOutReturnValue, layout->GetArgumentsObjectLocation(), branchValue, argoutRestoreAddress);
    return result;
}